

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

void vera::dynamicCubemap
               (function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                *_renderFnc,string *_file,vec3 _pos,int _viewSize)

{
  vec3 _pos_00;
  bool bVar1;
  uint uVar2;
  GLuint GVar3;
  int _width;
  int _height;
  ostream *poVar4;
  void *this;
  uchar *_pixels;
  socklen_t in_ECX;
  int _viewSize_00;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  uint32_t _width_00;
  ulong uVar5;
  uchar *pixels;
  int height;
  int width;
  function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> local_60;
  uint local_3c;
  string *psStack_38;
  int _viewSize_local;
  string *_file_local;
  function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *_renderFnc_local;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1c;
  undefined8 local_14;
  vec3 _pos_local;
  
  local_1c = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)_pos.field_2;
  register0x00001200 = _pos._0_8_;
  local_3c = _viewSize;
  psStack_38 = _file;
  _file_local = (string *)_renderFnc;
  local_14 = register0x00001200;
  _pos_local.field_0 = local_1c;
  bVar1 = Fbo::isAllocated((Fbo *)cubemapFbo);
  _width_00 = (uint32_t)_file;
  if (((!bVar1) || (uVar2 = Fbo::getWidth((Fbo *)cubemapFbo), uVar2 != local_3c)) ||
     (uVar2 = Fbo::getHeight((Fbo *)cubemapFbo), __addr = extraout_RDX, uVar2 != local_3c)) {
    _width_00 = local_3c << 2;
    in_ECX = 1;
    Fbo::allocate((Fbo *)cubemapFbo,_width_00,local_3c * 3,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,REPEAT,
                  true);
    __addr = extraout_RDX_00;
  }
  Fbo::bind((Fbo *)cubemapFbo,_width_00,__addr,in_ECX);
  std::function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>::function
            (&local_60,_renderFnc);
  _pos_00.field_2.z = _pos_local.field_0.x;
  _pos_00.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_14;
  _pos_00.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_14._4_4_;
  dynamicCubemap((vera *)&local_60,
                 (function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *)
                 (ulong)local_3c,_pos_00,_viewSize_00);
  std::function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>::~function
            (&local_60);
  Fbo::unbind((Fbo *)cubemapFbo);
  GVar3 = Fbo::getId((Fbo *)cubemapFbo);
  glBindFramebuffer(0x8d40,GVar3);
  _width = Fbo::getWidth((Fbo *)cubemapFbo);
  _height = Fbo::getHeight((Fbo *)cubemapFbo);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,_width);
  poVar4 = std::operator<<(poVar4,"x");
  this = (void *)std::ostream::operator<<(poVar4,_height);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  uVar5 = (ulong)(_width * _height * 4);
  if ((long)uVar5 < 0) {
    uVar5 = 0xffffffffffffffff;
  }
  _pixels = (uchar *)operator_new__(uVar5);
  glReadPixels(0,0,_width,_height,0x1908,0x1401,_pixels);
  savePixels(psStack_38,_pixels,_width,_height);
  if (_pixels != (uchar *)0x0) {
    operator_delete__(_pixels);
  }
  glBindFramebuffer(0x8d40,0);
  return;
}

Assistant:

void dynamicCubemap(std::function<void(Camera&, glm::vec4&, int&)> _renderFnc, const std::string& _file, glm::vec3 _pos, int _viewSize) {
    if (!cubemapFbo.isAllocated() || cubemapFbo.getWidth() != _viewSize || cubemapFbo.getHeight() != _viewSize)
        cubemapFbo.allocate(_viewSize * 4, _viewSize * 3, COLOR_TEXTURE_DEPTH_BUFFER);

    cubemapFbo.bind();

    dynamicCubemap(_renderFnc, _pos, _viewSize);

    cubemapFbo.unbind();

    glBindFramebuffer(GL_FRAMEBUFFER, cubemapFbo.getId());
    int width = cubemapFbo.getWidth();
    int height = cubemapFbo.getHeight();
    std::cout << width << "x" << height << std::endl;

    unsigned char* pixels = new unsigned char[width * height*4];
    glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, pixels);
    savePixels(_file, pixels, width, height);
    delete[] pixels;
    glBindFramebuffer(GL_FRAMEBUFFER, 0);
}